

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O2

void __thiscall FIX::FileLog::onOutgoing(FileLog *this,string *value)

{
  ostream *poVar1;
  int in_ECX;
  string sStack_58;
  UtcTimeStampConvertor local_38 [24];
  
  UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_38);
  UtcTimeStampConvertor::convert_abi_cxx11_(&sStack_58,local_38,(UtcTimeStamp *)0x9,in_ECX);
  poVar1 = std::operator<<((ostream *)&this->m_messages,(string *)&sStack_58);
  poVar1 = std::operator<<(poVar1," : ");
  poVar1 = std::operator<<(poVar1,(string *)value);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

void onOutgoing( const std::string& value )
  { m_messages << UtcTimeStampConvertor::convert(UtcTimeStamp(), 9) << " : " << value << std::endl; }